

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O1

QDebug qt_QMetaEnum_flagDebugOperator(QDebug *debug,quint64 value,QMetaObject *meta,char *name)

{
  int *piVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  QTextStream *pQVar5;
  Stream *pSVar6;
  bool bVar7;
  int index;
  qsizetype qVar8;
  char *pcVar9;
  QString *pQVar10;
  QString *pQVar11;
  char *in_R8;
  long in_FS_OFFSET;
  QStringView string;
  QStringView string_00;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QDebugStateSaver saver;
  QMetaEnum local_68;
  QDebugStateSaver local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = *(int *)(*(long *)value + 0x34);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  pQVar10 = (QString *)name;
  QDebugStateSaver::QDebugStateSaver(&local_58,(QDebug *)value);
  QTextStream::reset(*(QTextStream **)value);
  lVar4 = *(long *)value;
  *(undefined4 *)(lVar4 + 0x34) = 2;
  *(undefined2 *)(lVar4 + 0x30) = 0;
  *(undefined1 *)(lVar4 + 0x31) = 1;
  local_68.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
  index = QMetaObject::indexOfEnumerator((QMetaObject *)name,in_R8);
  local_68 = QMetaObject::enumerator((QMetaObject *)name,index);
  if (1 < iVar3) {
    pQVar5 = *(QTextStream **)value;
    qVar8 = QtPrivate::qustrlen(L"QFlags<");
    string.m_data = L"QFlags<";
    string.m_size = qVar8;
    QTextStream::operator<<(pQVar5,string);
    if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(*(QTextStream **)value,' ');
    }
    pcVar9 = QMetaEnum::scope(&local_68);
    if (pcVar9 != (char *)0x0) {
      pQVar5 = *(QTextStream **)value;
      pQVar11 = (QString *)0xffffffffffffffff;
      do {
        pcVar2 = pcVar9 + 1 + (long)pQVar11;
        pQVar11 = (QString *)((long)&(pQVar11->d).d + 1);
      } while (*pcVar2 != '\0');
      ba.m_data = (storage_type *)pQVar10;
      ba.m_size = (qsizetype)pcVar9;
      QString::fromUtf8(&local_50,pQVar11,ba);
      QTextStream::operator<<(pQVar5,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
        QTextStream::operator<<(*(QTextStream **)value,' ');
      }
      pQVar5 = *(QTextStream **)value;
      qVar8 = QtPrivate::qustrlen(L"::");
      string_00.m_data = L"::";
      string_00.m_size = qVar8;
      QTextStream::operator<<(pQVar5,string_00);
      if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
        QTextStream::operator<<(*(QTextStream **)value,' ');
      }
    }
  }
  bVar7 = QMetaEnum::isScoped(&local_68);
  if (0 < iVar3 || bVar7) {
    pcVar9 = QMetaEnum::enumName(&local_68);
    if (pcVar9 == (char *)0x0) {
      pQVar11 = (QString *)0x0;
    }
    else {
      pQVar11 = (QString *)0xffffffffffffffff;
      do {
        pQVar10 = (QString *)((long)&(pQVar11->d).d + 1);
        pcVar2 = pcVar9 + 1 + (long)pQVar11;
        pQVar11 = pQVar10;
      } while (*pcVar2 != '\0');
    }
    pQVar5 = *(QTextStream **)value;
    ba_00.m_data = (storage_type *)pQVar10;
    ba_00.m_size = (qsizetype)pcVar9;
    QString::fromUtf8(&local_50,pQVar11,ba_00);
    QTextStream::operator<<(pQVar5,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(*(QTextStream **)value,' ');
    }
    if (1 < iVar3) {
      QTextStream::operator<<(*(QTextStream **)value,'>');
      if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
        QTextStream::operator<<(*(QTextStream **)value,' ');
      }
    }
    QTextStream::operator<<(*(QTextStream **)value,'(');
    if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(*(QTextStream **)value,' ');
    }
  }
  QMetaEnum::valueToKeys((QByteArray *)&local_50,&local_68,(quint64)meta);
  if (local_50.d.ptr == (char16_t *)0x0) {
    local_50.d.ptr = L"";
  }
  QDebug::putByteArray((QDebug *)value,(char *)local_50.d.ptr,local_50.d.size,ContainsBinary);
  if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)value,' ');
  }
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (0 < iVar3 || bVar7) {
    QTextStream::operator<<(*(QTextStream **)value,')');
    if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(*(QTextStream **)value,' ');
    }
  }
  pSVar6 = *(Stream **)value;
  debug->stream = pSVar6;
  piVar1 = &pSVar6->ref;
  *piVar1 = *piVar1 + 1;
  QDebugStateSaver::~QDebugStateSaver(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)debug;
}

Assistant:

QDebug qt_QMetaEnum_flagDebugOperator(QDebug &debug, quint64 value, const QMetaObject *meta, const char *name)
{
    const int verbosity = debug.verbosity();

    QDebugStateSaver saver(debug);
    debug.resetFormat();
    debug.noquote();
    debug.nospace();

    const QMetaEnum me = meta->enumerator(meta->indexOfEnumerator(name));

    const bool classScope = verbosity >= QDebug::DefaultVerbosity;
    if (classScope) {
        debug << u"QFlags<";

        if (const char *scope = me.scope())
            debug << scope << u"::";
    }

    const bool enumScope = me.isScoped() || verbosity > QDebug::MinimumVerbosity;
    if (enumScope) {
        debug << me.enumName();
        if (classScope)
            debug << '>';
        debug << '(';
    }

    debug << me.valueToKeys(value);

    if (enumScope)
        debug << ')';

    return debug;
}